

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# search.cpp
# Opt level: O0

double megumax::rollout(Position *forwarded_position,UCTNode *expanded_node)

{
  GameState GVar1;
  undefined8 in_RDI;
  int times;
  Position *in_stack_00000008;
  double score;
  Position *in_stack_00000070;
  double in_stack_ffffffffffffffd8;
  undefined4 in_stack_ffffffffffffffe0;
  undefined8 local_18;
  
  times = (int)((ulong)in_RDI >> 0x20);
  GVar1 = libchess::Position::game_state(in_stack_00000008);
  if (GVar1 == IN_PROGRESS) {
    eval(in_stack_00000070);
    local_18 = sigmoid((double)CONCAT44(GVar1,in_stack_ffffffffffffffe0),in_stack_ffffffffffffffd8);
  }
  else if (GVar1 == CHECKMATE) {
    local_18 = 0.0;
  }
  else {
    if (2 < GVar1 - STALEMATE) {
      abort();
    }
    local_18 = 0.5;
  }
  UCTNode::depth((UCTNode *)CONCAT44(GVar1,in_stack_ffffffffffffffe0));
  rewind_position((Position *)CONCAT44(GVar1,in_stack_ffffffffffffffe0),times);
  return 1.0 - local_18;
}

Assistant:

double rollout(Position& forwarded_position, UCTNode* expanded_node) {
    double score;

    switch (forwarded_position.game_state()) {
        case Position::GameState::THREEFOLD_REPETITION:
        case Position::GameState::FIFTY_MOVES:
        case Position::GameState::STALEMATE:
            score = 0.5;
            break;
        case Position::GameState::CHECKMATE:
            score = 0.0;
            break;
        case Position::GameState::IN_PROGRESS:
            score = sigmoid(0.1 * eval(forwarded_position));
            break;
        default:
            abort();
    }

    rewind_position(forwarded_position, expanded_node->depth());
    return 1.0 - score;
}